

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcDataStream::dec_ofs(CTcDataStream *this,int amount)

{
  char *pcVar1;
  int in_ESI;
  CTcDataStream *in_RDI;
  
  in_RDI->ofs_ = in_RDI->ofs_ - (long)in_ESI;
  in_RDI->page_cur_ = in_RDI->ofs_ / 65000;
  in_RDI->rem_ = 65000 - in_RDI->ofs_ % 65000;
  pcVar1 = calc_addr(in_RDI,in_RDI->ofs_);
  in_RDI->wp_ = pcVar1;
  return;
}

Assistant:

void CTcDataStream::dec_ofs(int amount)
{
    /* adjust the offset */
    ofs_ -= amount;

    /* 
     *   calculate the new page we're on, since this may take us to a
     *   different page 
     */
    page_cur_ = ofs_ / TCCS_PAGE_SIZE;

    /* calculate the remaining size in this page */
    rem_ = TCCS_PAGE_SIZE - (ofs_ % TCCS_PAGE_SIZE);

    /* calculate the current write pointer */
    wp_ = calc_addr(ofs_);
}